

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScheduledReporter.cc
# Opt level: O3

void __thiscall cppmetrics::ScheduledReporter::loop_while_running(ScheduledReporter *this)

{
  byte bVar1;
  cv_status cVar2;
  long lVar3;
  unique_lock<std::mutex> lock;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  next_report_time;
  unique_lock<std::mutex> local_40;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_30;
  
  do {
    lVar3 = std::chrono::_V2::system_clock::now();
    local_30.__d.__r = (duration)(lVar3 + (this->m_interval).__r);
    local_40._M_owns = false;
    local_40._M_device = &this->m_mutex;
    std::unique_lock<std::mutex>::lock(&local_40);
    local_40._M_owns = true;
    bVar1 = this->m_is_running;
    if ((bool)bVar1 == true) {
      do {
        lVar3 = std::chrono::_V2::system_clock::now();
        if ((long)local_30.__d.__r <= lVar3) {
          bVar1 = this->m_is_running;
          break;
        }
        do {
          bVar1 = this->m_is_running;
          if ((bool)bVar1 != true) goto LAB_00118925;
          cVar2 = std::condition_variable::
                  __wait_until_impl<std::chrono::duration<long,std::ratio<1l,1000000000l>>>
                            (&this->m_cv,&local_40,&local_30);
        } while (cVar2 != timeout);
        bVar1 = this->m_is_running;
LAB_00118925:
      } while ((bVar1 & 1) != 0);
    }
    if ((bVar1 & 1) == 0) {
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      return;
    }
    std::unique_lock<std::mutex>::unlock(&local_40);
    (*(this->super_Reporter)._vptr_Reporter[2])(this);
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
  } while( true );
}

Assistant:

void ScheduledReporter::loop_while_running()
{
  while (true)
  {
    auto start = std::chrono::system_clock::now();
    auto next_report_time = start + m_interval;

    std::unique_lock<std::mutex> lock(m_mutex);

    while (m_is_running && next_report_time > std::chrono::system_clock::now())
    {
      m_cv.wait_until(lock, next_report_time, [&]() {
        // Predicate returns 'false' if waiting should continue.
        // We want to stop waiting if we have ceased running,
        // and to continue waiting while we are running.
        return !m_is_running;
      });
    }

    if (!m_is_running)
    {
      return;
    }

    lock.unlock();
    report();
  }
}